

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O1

int executemacro(int f,int n)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  if ((macrodef == 0) && ((macrocount < 0x100 || (macro[0xff].m_funct == finishmacro)))) {
    iVar2 = 1;
    if (macrocount != 0) {
      inmacro = 1;
      if (0 < n) {
        do {
          maclcur = maclhead->l_fp;
          if (1 < macrocount) {
            iVar5 = 0;
            iVar2 = 1;
            iVar3 = 0;
            do {
              if (macro[iVar3].m_funct == universal_argument) {
                iVar4 = iVar3 + 1;
                iVar2 = macro[(long)iVar3 + 1].m_count;
                iVar5 = 7;
              }
              else {
                iVar2 = (*macro[iVar3].m_funct)(iVar5,iVar2);
                if (iVar2 != 1) {
                  inmacro = 0;
                  return 0;
                }
                lastflag = thisflag;
                thisflag = 0;
                iVar2 = 1;
                iVar5 = 0;
                iVar4 = iVar3;
              }
              iVar3 = iVar4 + 1;
            } while (iVar3 < macrocount + -1);
          }
          bVar1 = 1 < n;
          n = n + -1;
        } while (bVar1);
      }
      inmacro = 0;
      iVar2 = 1;
    }
  }
  else {
    dobeep();
    iVar2 = 0;
    ewprintf("Macro too long. Aborting.");
  }
  return iVar2;
}

Assistant:

int
executemacro(int f, int n)
{
	int	 i, j, flag, num;
	PF	 funct;

	if (macrodef ||
	    (macrocount >= MAXMACRO && macro[MAXMACRO - 1].m_funct
	    != finishmacro)) {
		dobeep();
		ewprintf("Macro too long. Aborting.");
		return (FALSE);
	}

	if (macrocount == 0)
		return (TRUE);

	inmacro = TRUE;

	for (i = n; i > 0; i--) {
		maclcur = maclhead->l_fp;
		flag = 0;
		num = 1;
		for (j = 0; j < macrocount - 1; j++) {
			funct = macro[j].m_funct;
			if (funct == universal_argument) {
				flag = FFARG;
				num = macro[++j].m_count;
				continue;
			}
			if ((*funct)(flag, num) != TRUE) {
				inmacro = FALSE;
				return (FALSE);
			}
			lastflag = thisflag;
			thisflag = 0;
			flag = 0;
			num = 1;
		}
	}
	inmacro = FALSE;
	return (TRUE);
}